

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O2

void alterneigh(nn_quant *nnq,int rad,int i,int al,int b,int g,int r)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  
  iVar5 = -1;
  if (-1 < i - rad) {
    iVar5 = i - rad;
  }
  iVar4 = rad + i;
  if (nnq->netsize <= rad + i) {
    iVar4 = nnq->netsize;
  }
  iVar6 = i + 1;
  piVar7 = nnq->radpower;
  do {
    i = i + -1;
    do {
      if (iVar4 <= iVar6 && i <= iVar5) {
        return;
      }
      iVar1 = piVar7[1];
      if (iVar6 < iVar4) {
        iVar2 = nnq->network[iVar6][0];
        iVar3 = nnq->network[iVar6][1];
        nnq->network[iVar6][0] = ((iVar2 - al) * iVar1) / -0x40000 + iVar2;
        nnq->network[iVar6][1] = ((iVar3 - b) * iVar1) / -0x40000 + iVar3;
        iVar2 = nnq->network[iVar6][2];
        nnq->network[iVar6][2] = ((iVar2 - g) * iVar1) / -0x40000 + iVar2;
        iVar2 = nnq->network[iVar6][3];
        nnq->network[iVar6][3] = ((iVar2 - r) * iVar1) / -0x40000 + iVar2;
        iVar6 = iVar6 + 1;
      }
      piVar7 = piVar7 + 1;
    } while (i <= iVar5);
    iVar2 = nnq->network[i][0];
    iVar3 = nnq->network[i][1];
    nnq->network[i][0] = ((iVar2 - al) * iVar1) / -0x40000 + iVar2;
    nnq->network[i][1] = ((iVar3 - b) * iVar1) / -0x40000 + iVar3;
    iVar2 = nnq->network[i][2];
    nnq->network[i][2] = ((iVar2 - g) * iVar1) / -0x40000 + iVar2;
    iVar2 = nnq->network[i][3];
    nnq->network[i][3] = ((iVar2 - r) * iVar1) / -0x40000 + iVar2;
  } while( true );
}

Assistant:

void alterneigh(nnq, rad,i,al,b,g,r)
nn_quant *nnq;
int rad,i;
register int al,b,g,r;
{
	register int j,k,lo,hi,a;
	register int *p, *q;

	lo = i-rad;
	if (lo<-1) lo=-1;
	hi = i+rad;
	if (hi>nnq->netsize) hi=nnq->netsize;

	j = i+1;
	k = i-1;
	q = nnq->radpower;
	while ((j<hi) || (k>lo)) {
		a = (*(++q));
		if (j<hi) {
			p = nnq->network[j];
			*p -= (a*(*p - al)) / alpharadbias;
			p++;
			*p -= (a*(*p - b)) / alpharadbias;
			p++;
			*p -= (a*(*p - g)) / alpharadbias;
			p++;
			*p -= (a*(*p - r)) / alpharadbias;
			j++;
		}
		if (k>lo) {
			p = nnq->network[k];
			*p -= (a*(*p - al)) / alpharadbias;
			p++;
			*p -= (a*(*p - b)) / alpharadbias;
			p++;
			*p -= (a*(*p - g)) / alpharadbias;
			p++;
			*p -= (a*(*p - r)) / alpharadbias;
			k--;
		}
	}
}